

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::renamefile(XipFile *this,string *romname,string *newname)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  element_type *this_00;
  _Self local_30;
  _Self local_28;
  iterator fi;
  string *newname_local;
  string *romname_local;
  XipFile *this_local;
  
  fi._M_node = (_Base_ptr)newname;
  clearromhdr(this);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::find(&this->_files,romname);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::end(&this->_files);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    printf("renamefile: %s not found\n",uVar2);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
             ::operator->(&local_28);
    this_00 = std::__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ppVar3->second);
    XipEntry::renamefile(this_00,(string *)fi._M_node,this,&this->_mm);
  }
  return;
}

Assistant:

virtual void renamefile(const std::string&romname, const std::string&newname)
    {
        clearromhdr(); // need to rewrite romhdr because we alloc new mem for the name
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("renamefile: %s not found\n", romname.c_str());
            return;
        }
        fi->second->renamefile(newname, *this, _mm);
    }